

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QMainWindowTabBar * __thiscall
QMainWindowLayout::findTabBar(QMainWindowLayout *this,QDockWidget *dockWidget)

{
  QMainWindowTabBar *this_00;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  QMainWindowTabBar *tabBar;
  long lVar5;
  
  lVar5 = *(long *)(this + 0x718);
  if (lVar5 == 0) {
    lVar5 = 0;
    uVar4 = 0;
  }
  else {
    if (**(char **)(lVar5 + 0x20) != -1) {
      uVar4 = 0;
      goto LAB_0043323f;
    }
    uVar1 = 1;
    do {
      uVar4 = uVar1;
      if (*(ulong *)(lVar5 + 0x10) == uVar4) {
        lVar5 = 0;
        uVar4 = 0;
        break;
      }
      uVar1 = uVar4 + 1;
    } while ((*(char **)(lVar5 + 0x20))[(ulong)((uint)uVar4 & 0x7f) + (uVar4 >> 7) * 0x90] == -1);
  }
  if (lVar5 == 0 && uVar4 == 0) {
    return (QMainWindowTabBar *)0x0;
  }
LAB_0043323f:
  do {
    lVar3 = (uVar4 >> 7) * 0x90;
    this_00 = *(QMainWindowTabBar **)
               (*(long *)(*(long *)(lVar5 + 0x20) + 0x80 + lVar3) +
               (ulong)*(byte *)((ulong)((uint)uVar4 & 0x7f) + *(long *)(lVar5 + 0x20) + lVar3) * 8);
    bVar2 = QMainWindowTabBar::contains((QMainWindowTabBar *)this_00,dockWidget);
    if (bVar2) {
      return this_00;
    }
    do {
      if (*(long *)(lVar5 + 0x10) - 1U == uVar4) {
        lVar5 = 0;
        uVar4 = 0;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (*(char *)((ulong)((uint)uVar4 & 0x7f) + (uVar4 >> 7) * 0x90 + *(long *)(lVar5 + 0x20))
             == -1);
    if ((lVar5 == 0) && (uVar4 == 0)) {
      return (QMainWindowTabBar *)0x0;
    }
  } while( true );
}

Assistant:

QMainWindowTabBar *QMainWindowLayout::findTabBar(const QDockWidget *dockWidget) const
{
     for (auto *bar : usedTabBars) {
        Q_ASSERT(qobject_cast<QMainWindowTabBar *>(bar));
        auto *tabBar = static_cast<QMainWindowTabBar *>(bar);
        if (tabBar->contains(dockWidget))
            return tabBar;
    }
    return nullptr;
}